

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O0

int ffggpb(fitsfile *fptr,long group,long firstelem,long nelem,uchar *array,int *status)

{
  LONGLONG local_58;
  char local_4d;
  int local_4c;
  char cdummy;
  LONGLONG LStack_48;
  int idummy;
  long row;
  int *status_local;
  uchar *array_local;
  long nelem_local;
  long firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  local_58 = group;
  if (group < 1) {
    local_58 = 1;
  }
  LStack_48 = local_58;
  row = (long)status;
  status_local = (int *)array;
  array_local = (uchar *)nelem;
  nelem_local = firstelem;
  firstelem_local = group;
  group_local = (long)fptr;
  ffgclb(fptr,1,local_58,firstelem,nelem,1,1,'\0',array,&local_4d,&local_4c,status);
  return *(int *)row;
}

Assistant:

int ffggpb( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            long  firstelem,  /* I - first vector element to read (1 = 1st)  */
            long  nelem,      /* I - number of values to read                */
            unsigned char *array, /* O - array of values that are returned   */
            int  *status)     /* IO - error status                           */
/*
  Read an array of group parameters from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
*/
{
    long row;
    int idummy;
    char cdummy;
    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgclb(fptr, 1, row, firstelem, nelem, 1, 1, 0,
               array, &cdummy, &idummy, status);
    return(*status);
}